

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtrclient.c
# Opt level: O0

int main(int argc,char **argv)

{
  long lVar1;
  byte bVar2;
  int iVar3;
  code *pcVar4;
  code *pcVar5;
  code *pcVar6;
  int *piVar7;
  char *pcVar8;
  long in_FS_OFFSET;
  char *errormsg_1;
  char *errormsg;
  FILE *export_file;
  char *template;
  int ret;
  aspa_update_fp aspa_update_fp;
  pfx_update_fp pfx_update_fp;
  spki_update_fp spki_update_fp;
  char **argv_local;
  int argc_local;
  undefined4 local_27c;
  exporter_state state;
  pfx_export_cb_arg arg;
  rtr_mgr_config *conf;
  tommy_hashlin prefix_hash;
  tommy_array prefixes;
  rtr_mgr_group groups [1];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  parse_cli(argc,argv);
  if (socket_count == 0) {
    print_usage(argv);
    exit(1);
  }
  init_sockets();
  prefixes._264_8_ = socket_config;
  pcVar4 = (code *)0x0;
  if ((activate_spki_update_cb & 1U) != 0) {
    pcVar4 = update_spki;
  }
  pcVar5 = (code *)0x0;
  if ((activate_pfx_update_cb & 1U) != 0) {
    pcVar5 = update_cb;
  }
  pcVar6 = (code *)0x0;
  if ((activate_aspa_update_cb & 1U) != 0) {
    pcVar6 = update_aspa;
  }
  iVar3 = rtr_mgr_init(&arg.hashtable,&prefixes.count,1,status_fp,0);
  if (iVar3 == -1) {
    fprintf(_stderr,"Error in rtr_mgr_init!\n");
  }
  else if (iVar3 == -2) {
    fprintf(_stderr,"Invalid params passed to rtr_mgr_init\n");
  }
  iVar3 = rtr_mgr_add_roa_support(arg.hashtable,pcVar5);
  if (iVar3 == -1) {
    fprintf(_stderr,"Failed initializing ROA support\n");
  }
  iVar3 = rtr_mgr_add_aspa_support(arg.hashtable,pcVar6);
  if (iVar3 == -1) {
    fprintf(_stderr,"Failed initializing ASPA support\n");
  }
  iVar3 = rtr_mgr_add_spki_support(arg.hashtable,pcVar4);
  if (iVar3 == -1) {
    fprintf(_stderr,"Failed initializing BGPSEC support\n");
  }
  rtr_mgr_setup_sockets(arg.hashtable,&prefixes.count,1,0x32,600);
  if (arg.hashtable == (tommy_hashlin *)0x0) {
    argv_local._4_4_ = 1;
  }
  else {
    if ((((export_pfx & 1U) == 0) && ((activate_pfx_update_cb & 1U) != 0)) && (1 < socket_count)) {
      printf("%-40s %-40s   %3s   %3s   %3s\n","host","Prefix","Prefix Length","","ASN");
    }
    else if (((export_pfx & 1U) == 0) && ((activate_pfx_update_cb & 1U) != 0)) {
      printf("%-40s   %3s   %3s   %3s\n","Prefix","Prefix Length","","ASN");
    }
    if ((export_pfx & 1U) == 0) {
      rtr_mgr_start(arg.hashtable);
      pause();
    }
    else {
      if (template_name == (char *)0x0) {
        export_file = (FILE *)anon_var_dwarf_41;
      }
      else {
        export_file = (FILE *)get_template(template_name);
      }
      errormsg = _stdout;
      if ((export_file_path != (char *)0x0) &&
         (errormsg = (char *)fopen(export_file_path,"w"), (FILE *)errormsg == (FILE *)0x0)) {
        piVar7 = __errno_location();
        pcVar8 = strerror(*piVar7);
        print_error_exit("\"%s\" could not be opened for writing: %s",_optarg,pcVar8);
      }
      rtr_mgr_start(arg.hashtable);
      while (bVar2 = rtr_mgr_conf_in_sync(arg.hashtable), ((bVar2 ^ 0xff) & 1) != 0) {
        sleep(1);
      }
      printf("Sync done\n");
      state.roas = (tommy_array *)&prefix_hash.count;
      arg.array = (tommy_array *)&conf;
      tommy_array_init((tommy_array *)&prefix_hash.count);
      tommy_hashlin_init((tommy_hashlin *)&conf);
      pfx_table_for_each_ipv4_record((arg.hashtable)->bucket[0xb],pfx_export_cb,&state.roas);
      pfx_table_for_each_ipv6_record((arg.hashtable)->bucket[0xb],pfx_export_cb,&state.roas);
      argc_local._0_1_ = 0;
      local_27c = 0;
      state._0_8_ = &prefix_hash.count;
      fmustach((char *)export_file,&template_itf,&argc_local,(FILE *)errormsg);
      tommy_hashlin_foreach((tommy_hashlin *)&conf,free);
      tommy_hashlin_done((tommy_hashlin *)&conf);
      tommy_array_done((tommy_array *)&prefix_hash.count);
      if ((errormsg != _stdout) && (iVar3 = fclose((FILE *)errormsg), iVar3 == -1)) {
        piVar7 = __errno_location();
        pcVar8 = strerror(*piVar7);
        print_error_exit("\"Error during write into output file: %s\"",pcVar8);
      }
    }
    rtr_mgr_stop(arg.hashtable);
    rtr_mgr_free(arg.hashtable);
    free((void *)prefixes._264_8_);
    argv_local._4_4_ = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv)
{
	parse_cli(argc, argv);

	if (socket_count == 0) {
		print_usage(argv);
		exit(EXIT_FAILURE);
	}

	init_sockets();

	struct rtr_mgr_config *conf;
	struct rtr_mgr_group groups[1];

	groups[0].sockets_len = socket_count;
	groups[0].sockets = (struct rtr_socket **)socket_config;
	groups[0].preference = 1;

	spki_update_fp spki_update_fp = activate_spki_update_cb ? update_spki : NULL;
	pfx_update_fp pfx_update_fp = activate_pfx_update_cb ? update_cb : NULL;
	aspa_update_fp aspa_update_fp = activate_aspa_update_cb ? update_aspa : NULL;

	int ret = rtr_mgr_init(&conf, groups, 1, status_fp, NULL);

	if (ret == RTR_ERROR)
		fprintf(stderr, "Error in rtr_mgr_init!\n");
	else if (ret == RTR_INVALID_PARAM)
		fprintf(stderr, "Invalid params passed to rtr_mgr_init\n");

	if (rtr_mgr_add_roa_support(conf, pfx_update_fp) == RTR_ERROR) {
		fprintf(stderr, "Failed initializing ROA support\n");
	}

	if (rtr_mgr_add_aspa_support(conf, aspa_update_fp) == RTR_ERROR) {
		fprintf(stderr, "Failed initializing ASPA support\n");
	}

	if (rtr_mgr_add_spki_support(conf, spki_update_fp) == RTR_ERROR) {
		fprintf(stderr, "Failed initializing BGPSEC support\n");
	}

	rtr_mgr_setup_sockets(conf, groups, 1, 50, 600, 600);

	if (!conf)
		return EXIT_FAILURE;

	if (!export_pfx && activate_pfx_update_cb && socket_count > 1)
		printf("%-40s %-40s   %3s   %3s   %3s\n", "host", "Prefix", "Prefix Length", "", "ASN");
	else if (!export_pfx && activate_pfx_update_cb)
		printf("%-40s   %3s   %3s   %3s\n", "Prefix", "Prefix Length", "", "ASN");

	if (export_pfx) {
		const char *template;

		if (template_name)
			template = get_template(template_name);
		else
			template = templates->template;
		FILE *export_file = stdout;

		if (export_file_path) {
			export_file = fopen(export_file_path, "w");
			if (!export_file) {
				char *errormsg = strerror(errno);

				print_error_exit("\"%s\" could not be opened for writing: %s", optarg, errormsg);
			}
		}

		rtr_mgr_start(conf);

		while (!rtr_mgr_conf_in_sync(conf))
			sleep(1);

		printf("Sync done\n");
		tommy_array prefixes;
		tommy_hashlin prefix_hash;
		struct pfx_export_cb_arg arg = {
			.array = &prefixes,
			.hashtable = &prefix_hash,
		};

		tommy_array_init(&prefixes);
		tommy_hashlin_init(&prefix_hash);

		pfx_table_for_each_ipv4_record(conf->pfx_table, pfx_export_cb, &arg);
		pfx_table_for_each_ipv6_record(conf->pfx_table, pfx_export_cb, &arg);

		struct exporter_state state = {
			.roa_section = false,
			.current_roa = 0,
			.roas = &prefixes,
		};

		fmustach(template, &template_itf, &state, export_file);

		tommy_hashlin_foreach(&prefix_hash, free);
		tommy_hashlin_done(&prefix_hash);
		tommy_array_done(&prefixes);

		if (export_file != stdout && fclose(export_file) == EOF) {
			char *errormsg = strerror(errno);

			print_error_exit("\"Error during write into output file: %s\"", errormsg);
		}

	} else {
		rtr_mgr_start(conf);
		pause();
	}

	rtr_mgr_stop(conf);
	rtr_mgr_free(conf);
	free(groups[0].sockets);

	return EXIT_SUCCESS;
}